

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O0

ssize_t readn(int fd,string *inBuffer)

{
  ssize_t sVar1;
  int *piVar2;
  allocator<char> local_1059;
  string local_1058 [32];
  char local_1038 [8];
  char buff [4096];
  long local_30;
  ssize_t readSum;
  ssize_t nread;
  string *inBuffer_local;
  ssize_t sStack_10;
  int fd_local;
  
  local_30 = 0;
  while( true ) {
    while (sVar1 = read(fd,local_1038,0x1000), sVar1 < 0) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        piVar2 = __errno_location();
        if (*piVar2 == 0xb) {
          sStack_10 = local_30;
        }
        else {
          perror("read error");
          sStack_10 = -1;
        }
        return sStack_10;
      }
    }
    if (sVar1 == 0) break;
    local_30 = local_30 + sVar1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char*,void>(local_1058,local_1038,local_1038 + sVar1,&local_1059);
    std::__cxx11::string::operator+=((string *)inBuffer,local_1058);
    std::__cxx11::string::~string(local_1058);
    std::allocator<char>::~allocator(&local_1059);
  }
  return local_30;
}

Assistant:

ssize_t readn(int fd, std::string &inBuffer) {
  ssize_t nread = 0;
  ssize_t readSum = 0;
  while (true) {
    char buff[MAX_BUFF];
    if ((nread = read(fd, buff, MAX_BUFF)) < 0) {
      if (errno == EINTR)
        continue;
      else if (errno == EAGAIN) {
        return readSum;
      } else {
        perror("read error");
        return -1;
      }
    } else if (nread == 0) {
      // printf("redsum = %d\n", readSum);
      break;
    }
    // printf("before inBuffer.size() = %d\n", inBuffer.size());
    // printf("nread = %d\n", nread);
    readSum += nread;
    // buff += nread;
    inBuffer += std::string(buff, buff + nread);
    // printf("after inBuffer.size() = %d\n", inBuffer.size());
  }
  return readSum;
}